

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conflict.cpp
# Opt level: O0

Clause * __thiscall SAT::getConfl(SAT *this,Reason *r,Lit p)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  Lit LVar4;
  Propagator **ppPVar5;
  undefined4 extraout_var;
  Lit *pLVar6;
  uint in_EDX;
  Reason *in_RSI;
  long in_RDI;
  Clause *c;
  int in_stack_ffffffffffffffac;
  Clause *in_stack_ffffffffffffffb0;
  Propagator *pPVar7;
  Clause *local_8;
  
  uVar2 = Reason::type(in_RSI);
  if (uVar2 == 0) {
    local_8 = Reason::pt(in_RSI);
  }
  else if (uVar2 == 1) {
    uVar2 = Reason::d2(in_RSI);
    ppPVar5 = vec<Propagator_*>::operator[](&engine.propagators,uVar2);
    pPVar7 = *ppPVar5;
    uVar2 = Reason::d1(in_RSI);
    iVar3 = (*pPVar7->_vptr_Propagator[5])(pPVar7,(ulong)in_EDX,(ulong)uVar2);
    local_8 = (Clause *)CONCAT44(extraout_var,iVar3);
  }
  else {
    puVar1 = *(uint **)(in_RDI + 0x188);
    uVar2 = Reason::type(in_RSI);
    *puVar1 = *puVar1 & 0xff | uVar2 << 8;
    Reason::d1(in_RSI);
    LVar4 = toLit(0x297d5a);
    pLVar6 = Clause::operator[](in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    pLVar6->x = LVar4.x;
    if (*puVar1 >> 8 == 3) {
      Reason::d2(in_RSI);
      LVar4 = toLit(0x297d93);
      pLVar6 = Clause::operator[](in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
      pLVar6->x = LVar4.x;
    }
    local_8 = *(Clause **)(in_RDI + 0x188);
  }
  return local_8;
}

Assistant:

Clause* SAT::getConfl(Reason& r, Lit p) const {
	switch (r.type()) {
		case 0:
			return r.pt();
		case 1:
			return engine.propagators[r.d2()]->explain(p, r.d1());
		default:
			Clause& c = *short_expl;
			c.sz = r.type();
			c[1] = toLit(r.d1());
			if (c.sz == 3) {
				c[2] = toLit(r.d2());
			}
			return short_expl;
	}
}